

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  undefined8 *in_RSI;
  Parameters params;
  char **in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  int argc_00;
  Parameters *in_stack_ffffffffffffffe0;
  uint local_4;
  
  argc_00 = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  Parameters::Parameters((Parameters *)0x1731f4);
  bVar1 = parse_args(argc_00,in_stack_ffffffffffffff88,(Parameters *)0x173207);
  if (bVar1) {
    flag_test(in_stack_ffffffffffffffe0);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Usage: ");
    poVar2 = std::operator<<(poVar2,(char *)*in_RSI);
    poVar2 = std::operator<<(poVar2,"[input-size [iterations-count [function-filter]]]");
    std::operator<<(poVar2,'\n');
  }
  local_4 = (uint)!bVar1;
  Parameters::~Parameters((Parameters *)0x1732c7);
  return local_4;
}

Assistant:

int main(int argc, char **argv) {
    Parameters params;

    if (!parse_args(argc, argv, params)) {
        std::cout << "Usage: " << argv[0] << "[input-size [iterations-count [function-filter]]]" << '\n';
        return EXIT_FAILURE;
    }

    flag_test(params);
    return EXIT_SUCCESS;
}